

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::OptionsToInterpret::~OptionsToInterpret(OptionsToInterpret *this)

{
  string *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

OptionsToInterpret(const std::string& ns, const std::string& el,
                     const std::vector<int>& path, const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        element_path(path),
        original_options(orig_opt),
        options(opt) {}